

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

uint64_t mcpl_read_buffer(mcpl_fileinternal_t *f,uint *n,char **buf,char *errmsg)

{
  int iVar1;
  size_t sVar2;
  char *__ptr;
  
  if (f->filegz == (gzFile)0x0) {
    sVar2 = fread(n,1,4,(FILE *)f->file);
  }
  else {
    iVar1 = gzread(f->filegz,n,4);
    sVar2 = (size_t)iVar1;
  }
  if (sVar2 == 4) {
    __ptr = mcpl_internal_calloc((ulong)*n,1);
    *buf = __ptr;
    if (f->filegz == (gzFile)0x0) {
      sVar2 = fread(__ptr,1,(ulong)*n,(FILE *)f->file);
    }
    else {
      iVar1 = gzread(f->filegz,__ptr);
      sVar2 = (size_t)iVar1;
    }
    if (sVar2 == *n) {
      return sVar2 + 4;
    }
  }
  (*mcpl_error_handler)(errmsg);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL uint64_t mcpl_read_buffer(mcpl_fileinternal_t* f, unsigned* n, char ** buf, const char * errmsg)
{
  //Reads buffer and returns number of bytes consumed from file
  size_t nb;
  if (f->filegz)
    nb = gzread(f->filegz, n, sizeof(*n));
  else
    nb = fread(n, 1, sizeof(*n), f->file);
  if (nb!=sizeof(*n))
    mcpl_error(errmsg);
  *buf = mcpl_internal_calloc(*n,1);
  if (f->filegz)
    nb = gzread(f->filegz, *buf, *n);
  else
    nb = fread(*buf, 1, *n, f->file);
  if (nb!=*n)
    mcpl_error(errmsg);
  return sizeof(*n) + *n;
}